

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *max,int param_2,bool param_3)

{
  uint *puVar1;
  undefined8 *puVar2;
  Real a;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar14;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar15;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  long lVar21;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max_00;
  long in_FS_OFFSET;
  type t;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_2ac;
  uint local_29c;
  cpp_dec_float<100U,_int,_void> local_298;
  cpp_dec_float<100U,_int,_void> local_248;
  cpp_dec_float<100U,_int,_void> local_1f8;
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1a0;
  cpp_dec_float<100U,_int,_void> local_198;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  cpp_dec_float<100U,_int,_void> *local_140;
  DataKey local_138;
  long local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  cpp_dec_float<100U,_int,_void> local_a8;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])
                     (this,max,CONCAT44(in_register_00000014,param_2),
                      CONCAT71(in_register_00000009,param_3));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar12) + 0xc38) + 0x68));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_00,iVar12) + 0xc40) + 0x68));
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_d8 = **(long **)(CONCAT44(extraout_var_01,iVar12) + 0xc40);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar17 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar12) + 0xc40) + 0x88);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar14 = *(long *)(CONCAT44(extraout_var_03,iVar12) + 0xc40);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c8 = **(long **)(CONCAT44(extraout_var_04,iVar12) + 0xc60);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b8 = **(long **)(CONCAT44(extraout_var_05,iVar12) + 0xc58);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_d0 = **(long **)(CONCAT44(extraout_var_06,iVar12) + 0xc38);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar16 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar12) + 0xc38) + 0x88);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_130 = *(long *)(CONCAT44(extraout_var_08,iVar12) + 0xc38);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_c0 = **(long **)(CONCAT44(extraout_var_09,iVar12) + 0xc70);
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_10,iVar12) + 0xc68);
  local_1a0 = this;
  iVar12 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_11,iVar12) + 0x1f8));
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems._56_5_ = 0;
  local_a8.data._M_elems[0xf]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_a8,a);
  local_1f8.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_1f8.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_1f8.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_1f8.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_1f8.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_1f8.data._M_elems._40_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 10);
  local_1f8.data._M_elems._48_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xc);
  local_1f8.data._M_elems._56_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xe);
  local_1f8.exp = (max->m_backend).exp;
  local_1f8.neg = (max->m_backend).neg;
  local_1f8.fpclass = (max->m_backend).fpclass;
  local_1f8.prec_elem = (max->m_backend).prec_elem;
  local_138.info = 0;
  local_138.idx = -1;
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  local_148 = max;
  if (local_1f8.fpclass == cpp_dec_float_NaN) {
LAB_00470629:
    local_29c = 0xffffffff;
    local_2ac = 0xffffffff;
    if (0 < *(int *)(lVar14 + 0x70)) {
      local_58 = *(double *)(in_FS_OFFSET + -8);
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_140 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_2ac = 0xffffffff;
      lVar18 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar14 + 0x78) + lVar18 * 4);
        lVar21 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar21);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar21) + 2);
        puVar1 = (uint *)(lVar17 + 0x10 + lVar21);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x20 + lVar21);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x30 + lVar21);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar17 + 0x40 + lVar21);
        local_128.neg = *(bool *)(lVar17 + 0x44 + lVar21);
        local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar21);
        if (local_a8.fpclass == cpp_dec_float_NaN || local_128.fpclass == cpp_dec_float_NaN) {
LAB_00470874:
          uVar3._0_4_ = local_a8.data._M_elems[0];
          uVar3._4_4_ = local_a8.data._M_elems[1];
          local_298.data._M_elems[0] = local_a8.data._M_elems[0];
          local_298.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar9._0_4_ = local_a8.data._M_elems[2];
          uVar9._4_4_ = local_a8.data._M_elems[3];
          local_298.data._M_elems[2] = local_a8.data._M_elems[2];
          local_298.data._M_elems[3] = local_a8.data._M_elems[3];
          local_298.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_298.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_298.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_298.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_298.data._M_elems[8] = local_a8.data._M_elems[8];
          local_298.data._M_elems[9] = local_a8.data._M_elems[9];
          local_298.data._M_elems[10] = local_a8.data._M_elems[10];
          local_298.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_298.data._M_elems[4] = local_a8.data._M_elems[4];
          local_298.data._M_elems[5] = local_a8.data._M_elems[5];
          local_298.data._M_elems[6] = local_a8.data._M_elems[6];
          local_298.data._M_elems[7] = local_a8.data._M_elems[7];
          local_298.exp = local_a8.exp;
          local_298.neg = local_a8.neg;
          local_298.prec_elem = local_a8.prec_elem;
          local_298.fpclass = local_a8.fpclass;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_298.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar8 = uVar3;
          uVar10 = uVar9;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar8 = local_298.data._M_elems._0_8_, uVar10 = local_298.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_298.data._M_elems._0_8_ = uVar3, local_298.data._M_elems._8_8_ = uVar9,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_298), uVar8 = local_298.data._M_elems._0_8_,
             uVar10 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b8 + lVar21);
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_298,local_58);
            uVar8 = local_298.data._M_elems._0_8_;
            uVar10 = local_298.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_298), uVar8 = local_298.data._M_elems._0_8_,
                     uVar10 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 0x10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems[6] = 0;
              local_248.data._M_elems[7] = 0;
              local_248.data._M_elems[8] = 0;
              local_248.data._M_elems[9] = 0;
              local_248.data._M_elems[10] = 0;
              local_248.data._M_elems[0xb] = 0;
              local_248.data._M_elems[0xc] = 0;
              local_248.data._M_elems[0xd] = 0;
              local_248.data._M_elems._56_5_ = 0;
              local_248.data._M_elems[0xf]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_248,pcVar20);
                if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                  local_248.neg = (bool)(local_248.neg ^ 1);
                }
              }
              else {
                if (&local_248 != pcVar20) {
                  local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_248.exp = pcVar20->exp;
                  local_248.neg = pcVar20->neg;
                  local_248.fpclass = pcVar20->fpclass;
                  local_248.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
              }
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              pcVar20 = &local_248;
              if (&local_198 != local_140) {
                local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_248.data._M_elems[8];
                local_198.data._M_elems[9] = local_248.data._M_elems[9];
                local_198.data._M_elems[10] = local_248.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_248.data._M_elems[4];
                local_198.data._M_elems[5] = local_248.data._M_elems[5];
                local_198.data._M_elems[6] = local_248.data._M_elems[6];
                local_198.data._M_elems[7] = local_248.data._M_elems[7];
                local_198.data._M_elems[0] = local_248.data._M_elems[0];
                local_198.data._M_elems[1] = local_248.data._M_elems[1];
                local_198.data._M_elems[2] = local_248.data._M_elems[2];
                local_198.data._M_elems[3] = local_248.data._M_elems[3];
                local_198.exp = local_248.exp;
                local_198.neg = local_248.neg;
                local_198.fpclass = local_248.fpclass;
                local_198.prec_elem = local_248.prec_elem;
                pcVar20 = local_140;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_198,pcVar20);
              goto LAB_00470c66;
            }
          }
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_128,&local_a8);
          if (iVar13 < 1) {
            goto LAB_00470874;
          }
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c8 + lVar21);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x10;
          local_298.data._M_elems[0] = 0;
          local_298.data._M_elems[1] = 0;
          local_298.data._M_elems[2] = 0;
          local_298.data._M_elems[3] = 0;
          local_298.data._M_elems[4] = 0;
          local_298.data._M_elems[5] = 0;
          local_298.data._M_elems[6] = 0;
          local_298.data._M_elems[7] = 0;
          local_298.data._M_elems[8] = 0;
          local_298.data._M_elems[9] = 0;
          local_298.data._M_elems[10] = 0;
          local_298.data._M_elems[0xb] = 0;
          local_298.data._M_elems[0xc] = 0;
          local_298.data._M_elems[0xd] = 0;
          local_298.data._M_elems._56_5_ = 0;
          local_298.data._M_elems[0xf]._1_3_ = 0;
          local_298.exp = 0;
          local_298.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_298,local_48);
          uVar8 = local_298.data._M_elems._0_8_;
          uVar10 = local_298.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_298), uVar8 = local_298.data._M_elems._0_8_,
                uVar10 = local_298.data._M_elems._8_8_, 0 < iVar13)) {
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x10;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems._56_5_ = 0;
            local_248.data._M_elems[0xf]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,pcVar20);
              if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                local_248.neg = (bool)(local_248.neg ^ 1);
              }
            }
            else {
              if (&local_248 != pcVar20) {
                local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_248.exp = pcVar20->exp;
                local_248.neg = pcVar20->neg;
                local_248.fpclass = pcVar20->fpclass;
                local_248.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
            }
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            if (&local_198 == local_140) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,&local_248);
              if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                local_198.neg = (bool)(local_198.neg ^ 1);
              }
            }
            else {
              local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_248.data._M_elems[8];
              local_198.data._M_elems[9] = local_248.data._M_elems[9];
              local_198.data._M_elems[10] = local_248.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_248.data._M_elems[4];
              local_198.data._M_elems[5] = local_248.data._M_elems[5];
              local_198.data._M_elems[6] = local_248.data._M_elems[6];
              local_198.data._M_elems[7] = local_248.data._M_elems[7];
              local_198.data._M_elems[0] = local_248.data._M_elems[0];
              local_198.data._M_elems[1] = local_248.data._M_elems[1];
              local_198.data._M_elems[2] = local_248.data._M_elems[2];
              local_198.data._M_elems[3] = local_248.data._M_elems[3];
              local_198.exp = local_248.exp;
              local_198.neg = local_248.neg;
              local_198.fpclass = local_248.fpclass;
              local_198.prec_elem = local_248.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,local_140);
            }
LAB_00470c66:
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_298,&local_198,&local_128);
            uVar8 = local_298.data._M_elems._0_8_;
            uVar10 = local_298.data._M_elems._8_8_;
            if (((local_298.fpclass != cpp_dec_float_NaN) &&
                (local_1f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_298,&local_1f8), uVar8 = local_298.data._M_elems._0_8_,
               uVar10 = local_298.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_1a0->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_138 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_13,iVar13),iVar12);
              local_1f8.data._M_elems[4] = local_298.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_298.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_298.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_298.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_298.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_298.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_298.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_298.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_298.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_298.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
              local_1f8.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
              local_1f8.data._M_elems[0] = local_298.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_298.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_298.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_298.data._M_elems[3];
              local_1f8.exp = local_298.exp;
              local_1f8.neg = local_298.neg;
              local_1f8.fpclass = local_298.fpclass;
              local_1f8.prec_elem = local_298.prec_elem;
              local_2ac = (uint)lVar18;
              uVar8 = local_298.data._M_elems._0_8_;
              uVar10 = local_298.data._M_elems._8_8_;
            }
          }
        }
        local_298.data._M_elems._8_8_ = uVar10;
        local_298.data._M_elems._0_8_ = uVar8;
        lVar18 = lVar18 + 1;
      } while (lVar18 < *(int *)(lVar14 + 0x70));
    }
    if (0 < *(int *)(local_130 + 0x70)) {
      local_58 = *(double *)(in_FS_OFFSET + -8);
      uStack_50 = 0;
      local_48 = -local_58;
      uStack_40 = 0x8000000000000000;
      local_140 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_29c = 0xffffffff;
      lVar21 = 0;
      lVar18 = local_130;
      do {
        iVar12 = *(int *)(*(long *)(lVar18 + 0x78) + lVar21 * 4);
        lVar19 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar19);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar19) + 2);
        puVar1 = (uint *)(lVar16 + 0x10 + lVar19);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar16 + 0x20 + lVar19);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar16 + 0x30 + lVar19);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar16 + 0x40 + lVar19);
        local_128.neg = *(bool *)(lVar16 + 0x44 + lVar19);
        local_128._72_8_ = *(undefined8 *)(lVar16 + 0x48 + lVar19);
        if (local_a8.fpclass == cpp_dec_float_NaN || local_128.fpclass == cpp_dec_float_NaN) {
LAB_00470fa1:
          uVar8._0_4_ = local_a8.data._M_elems[0];
          uVar8._4_4_ = local_a8.data._M_elems[1];
          local_298.data._M_elems[0] = local_a8.data._M_elems[0];
          local_298.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar10._0_4_ = local_a8.data._M_elems[2];
          uVar10._4_4_ = local_a8.data._M_elems[3];
          local_298.data._M_elems[2] = local_a8.data._M_elems[2];
          local_298.data._M_elems[3] = local_a8.data._M_elems[3];
          local_298.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_298.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_298.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_298.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_298.data._M_elems[8] = local_a8.data._M_elems[8];
          local_298.data._M_elems[9] = local_a8.data._M_elems[9];
          local_298.data._M_elems[10] = local_a8.data._M_elems[10];
          local_298.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_298.data._M_elems[4] = local_a8.data._M_elems[4];
          local_298.data._M_elems[5] = local_a8.data._M_elems[5];
          local_298.data._M_elems[6] = local_a8.data._M_elems[6];
          local_298.data._M_elems[7] = local_a8.data._M_elems[7];
          local_298.exp = local_a8.exp;
          local_298.neg = local_a8.neg;
          local_298.prec_elem = local_a8.prec_elem;
          local_298.fpclass = local_a8.fpclass;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_298.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar3 = uVar8;
          uVar9 = uVar10;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_298.data._M_elems._0_8_, uVar9 = local_298.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_298.data._M_elems._0_8_ = uVar8, local_298.data._M_elems._8_8_ = uVar10,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_298), uVar3 = local_298.data._M_elems._0_8_,
             uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b0 + lVar19);
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_298,local_58);
            lVar18 = local_130;
            uVar3 = local_298.data._M_elems._0_8_;
            uVar9 = local_298.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_298), lVar18 = local_130,
                     uVar3 = local_298.data._M_elems._0_8_, uVar9 = local_298.data._M_elems._8_8_,
                     iVar13 < 0)) {
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 0x10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems[6] = 0;
              local_248.data._M_elems[7] = 0;
              local_248.data._M_elems[8] = 0;
              local_248.data._M_elems[9] = 0;
              local_248.data._M_elems[10] = 0;
              local_248.data._M_elems[0xb] = 0;
              local_248.data._M_elems[0xc] = 0;
              local_248.data._M_elems[0xd] = 0;
              local_248.data._M_elems._56_5_ = 0;
              local_248.data._M_elems[0xf]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar19 + local_d0)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_248,pcVar20);
                if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                  local_248.neg = (bool)(local_248.neg ^ 1);
                }
              }
              else {
                if (&local_248 != pcVar20) {
                  local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_248.exp = pcVar20->exp;
                  local_248.neg = pcVar20->neg;
                  local_248.fpclass = pcVar20->fpclass;
                  local_248.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar19 + local_d0));
              }
              lVar18 = local_130;
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              pcVar20 = &local_248;
              if (&local_198 != local_140) {
                local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_248.data._M_elems[8];
                local_198.data._M_elems[9] = local_248.data._M_elems[9];
                local_198.data._M_elems[10] = local_248.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_248.data._M_elems[4];
                local_198.data._M_elems[5] = local_248.data._M_elems[5];
                local_198.data._M_elems[6] = local_248.data._M_elems[6];
                local_198.data._M_elems[7] = local_248.data._M_elems[7];
                local_198.data._M_elems[0] = local_248.data._M_elems[0];
                local_198.data._M_elems[1] = local_248.data._M_elems[1];
                local_198.data._M_elems[2] = local_248.data._M_elems[2];
                local_198.data._M_elems[3] = local_248.data._M_elems[3];
                local_198.exp = local_248.exp;
                local_198.neg = local_248.neg;
                local_198.fpclass = local_248.fpclass;
                local_198.prec_elem = local_248.prec_elem;
                pcVar20 = local_140;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&local_198,pcVar20);
              goto LAB_004713a7;
            }
          }
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_128,&local_a8);
          if (iVar13 < 1) {
            goto LAB_00470fa1;
          }
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c0 + lVar19);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x10;
          local_298.data._M_elems[0] = 0;
          local_298.data._M_elems[1] = 0;
          local_298.data._M_elems[2] = 0;
          local_298.data._M_elems[3] = 0;
          local_298.data._M_elems[4] = 0;
          local_298.data._M_elems[5] = 0;
          local_298.data._M_elems[6] = 0;
          local_298.data._M_elems[7] = 0;
          local_298.data._M_elems[8] = 0;
          local_298.data._M_elems[9] = 0;
          local_298.data._M_elems[10] = 0;
          local_298.data._M_elems[0xb] = 0;
          local_298.data._M_elems[0xc] = 0;
          local_298.data._M_elems[0xd] = 0;
          local_298.data._M_elems._56_5_ = 0;
          local_298.data._M_elems[0xf]._1_3_ = 0;
          local_298.exp = 0;
          local_298.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_298,local_48);
          lVar18 = local_130;
          uVar3 = local_298.data._M_elems._0_8_;
          uVar9 = local_298.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_298), lVar18 = local_130,
                uVar3 = local_298.data._M_elems._0_8_, uVar9 = local_298.data._M_elems._8_8_,
                0 < iVar13)) {
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x10;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems._56_5_ = 0;
            local_248.data._M_elems[0xf]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar19 + local_d0)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,pcVar20);
              if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                local_248.neg = (bool)(local_248.neg ^ 1);
              }
            }
            else {
              if (&local_248 != pcVar20) {
                local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_248.exp = pcVar20->exp;
                local_248.neg = pcVar20->neg;
                local_248.fpclass = pcVar20->fpclass;
                local_248.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar19 + local_d0));
            }
            lVar18 = local_130;
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            if (&local_198 == local_140) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,&local_248);
              if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                local_198.neg = (bool)(local_198.neg ^ 1);
              }
            }
            else {
              local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_248.data._M_elems[8];
              local_198.data._M_elems[9] = local_248.data._M_elems[9];
              local_198.data._M_elems[10] = local_248.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_248.data._M_elems[4];
              local_198.data._M_elems[5] = local_248.data._M_elems[5];
              local_198.data._M_elems[6] = local_248.data._M_elems[6];
              local_198.data._M_elems[7] = local_248.data._M_elems[7];
              local_198.data._M_elems[0] = local_248.data._M_elems[0];
              local_198.data._M_elems[1] = local_248.data._M_elems[1];
              local_198.data._M_elems[2] = local_248.data._M_elems[2];
              local_198.data._M_elems[3] = local_248.data._M_elems[3];
              local_198.exp = local_248.exp;
              local_198.neg = local_248.neg;
              local_198.fpclass = local_248.fpclass;
              local_198.prec_elem = local_248.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,local_140);
            }
LAB_004713a7:
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_298,&local_198,&local_128);
            uVar3 = local_298.data._M_elems._0_8_;
            uVar9 = local_298.data._M_elems._8_8_;
            if (((local_298.fpclass != cpp_dec_float_NaN) &&
                (local_1f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_298,&local_1f8), uVar3 = local_298.data._M_elems._0_8_,
               uVar9 = local_298.data._M_elems._8_8_, 0 < iVar13)) {
              iVar13 = (*(local_1a0->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_138 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(extraout_var_14,iVar13),iVar12);
              local_1f8.data._M_elems[4] = local_298.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_298.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_298.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_298.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_298.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_298.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_298.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_298.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_298.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_298.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
              local_1f8.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
              local_1f8.data._M_elems[0] = local_298.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_298.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_298.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_298.data._M_elems[3];
              local_1f8.exp = local_298.exp;
              local_1f8.neg = local_298.neg;
              local_1f8.fpclass = local_298.fpclass;
              local_1f8.prec_elem = local_298.prec_elem;
              local_29c = (uint)lVar21;
              uVar3 = local_298.data._M_elems._0_8_;
              uVar9 = local_298.data._M_elems._8_8_;
            }
          }
        }
        local_298.data._M_elems._8_8_ = uVar9;
        local_298.data._M_elems._0_8_ = uVar3;
        lVar19 = local_c0;
        max_00 = local_148;
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(lVar18 + 0x70));
      if (-1 < (int)local_29c) {
        lVar17 = (long)*(int *)(*(long *)(lVar18 + 0x78) + (ulong)local_29c * 4);
        lVar14 = lVar17 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar14);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar14) + 2);
        puVar1 = (uint *)(lVar16 + 0x10 + lVar14);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar16 + 0x20 + lVar14);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar16 + 0x30 + lVar14);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar16 + 0x40 + lVar14);
        local_128.neg = *(bool *)(lVar16 + 0x44 + lVar14);
        local_128._72_8_ = *(undefined8 *)(lVar16 + 0x48 + lVar14);
        if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_128,&local_a8), iVar12 < 0)) {
          lVar19 = local_b0;
        }
        goto LAB_00471f1d;
      }
    }
    lVar16 = local_c8;
    max_00 = local_148;
    if ((int)local_2ac < 0) goto LAB_004721e9;
    lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x78) + (ulong)local_2ac * 4);
    lVar18 = lVar14 * 0x50;
    local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar18);
    local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar18) + 2);
    puVar1 = (uint *)(lVar17 + 0x10 + lVar18);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar17 + 0x20 + lVar18);
    local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar17 + 0x30 + lVar18);
    local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_128.exp = *(int *)(lVar17 + 0x40 + lVar18);
    local_128.neg = *(bool *)(lVar17 + 0x44 + lVar18);
    local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar18);
    if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_128,&local_a8), iVar12 < 0)) {
      lVar16 = local_b8;
    }
LAB_0047203b:
    lVar14 = lVar14 * 0x50;
    local_1f8.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar14);
    local_1f8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar14) + 2);
    puVar1 = (uint *)(lVar16 + 0x10 + lVar14);
    local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar16 + 0x20 + lVar14);
    local_1f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar16 + 0x30 + lVar14);
    local_1f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_1f8.exp = *(int *)(lVar16 + 0x40 + lVar14);
    local_1f8.neg = *(bool *)(lVar16 + 0x44 + lVar14);
    local_1f8.fpclass = *(fpclass_type *)(lVar16 + 0x48 + lVar14);
    local_1f8.prec_elem = *(int32_t *)(lVar16 + 0x4c + lVar14);
    pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_d8 + lVar14);
    max_00 = local_148;
    if (&local_198 != pcVar20) {
      local_198.data._M_elems._56_5_ = local_1f8.data._M_elems._56_5_;
      local_198.data._M_elems[0xf]._1_3_ = local_1f8.data._M_elems[0xf]._1_3_;
      local_198.prec_elem = local_1f8.prec_elem;
      local_198.fpclass = local_1f8.fpclass;
      local_198.data._M_elems._0_8_ = local_1f8.data._M_elems._0_8_;
      local_198.data._M_elems._8_8_ = local_1f8.data._M_elems._8_8_;
      local_198.data._M_elems._16_8_ = local_1f8.data._M_elems._16_8_;
      local_198.data._M_elems._24_8_ = local_1f8.data._M_elems._24_8_;
      local_198.data._M_elems._32_8_ = local_1f8.data._M_elems._32_8_;
      local_198.data._M_elems._40_8_ = local_1f8.data._M_elems._40_8_;
      local_198.data._M_elems._48_8_ = local_1f8.data._M_elems._48_8_;
      local_198.exp = local_1f8.exp;
      local_198.neg = local_1f8.neg;
      goto LAB_00472127;
    }
LAB_0047212e:
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 0x10;
    local_198.neg = false;
    local_198.exp = 0;
    local_198.data._M_elems[0xf]._1_3_ = 0;
    local_198.data._M_elems._56_5_ = 0;
    local_198.data._M_elems[0xc] = 0;
    local_198.data._M_elems[0xd] = 0;
    local_198.data._M_elems[10] = 0;
    local_198.data._M_elems[0xb] = 0;
    local_198.data._M_elems[8] = 0;
    local_198.data._M_elems[9] = 0;
    local_198.data._M_elems[6] = 0;
    local_198.data._M_elems[7] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&local_198,&local_1f8);
    if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
      local_198.neg = (bool)(local_198.neg ^ 1);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_298,0,(type *)0x0);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_1f8,&local_298);
    if (iVar12 < 1) goto LAB_00470629;
    local_29c = 0xffffffff;
    local_2ac = 0xffffffff;
    if (0 < *(int *)(lVar14 + 0x70)) {
      local_48 = *(double *)(in_FS_OFFSET + -8);
      local_140 = &(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      uStack_40 = 0;
      local_58 = -local_48;
      uStack_50 = 0x8000000000000000;
      local_2ac = 0xffffffff;
      lVar18 = 0;
      do {
        iVar12 = *(int *)(*(long *)(lVar14 + 0x78) + lVar18 * 4);
        lVar21 = (long)iVar12 * 0x50;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar21);
        local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar21) + 2);
        puVar1 = (uint *)(lVar17 + 0x10 + lVar21);
        local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x20 + lVar21);
        local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)(lVar17 + 0x30 + lVar21);
        local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        uVar3 = *(undefined8 *)(puVar1 + 2);
        local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
        local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_128.exp = *(int *)(lVar17 + 0x40 + lVar21);
        local_128.neg = *(bool *)(lVar17 + 0x44 + lVar21);
        local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar21);
        if (local_a8.fpclass == cpp_dec_float_NaN || local_128.fpclass == cpp_dec_float_NaN) {
LAB_0047013a:
          uVar4._0_4_ = local_a8.data._M_elems[0];
          uVar4._4_4_ = local_a8.data._M_elems[1];
          local_298.data._M_elems[0] = local_a8.data._M_elems[0];
          local_298.data._M_elems[1] = local_a8.data._M_elems[1];
          uVar5._0_4_ = local_a8.data._M_elems[2];
          uVar5._4_4_ = local_a8.data._M_elems[3];
          local_298.data._M_elems[2] = local_a8.data._M_elems[2];
          local_298.data._M_elems[3] = local_a8.data._M_elems[3];
          local_298.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
          local_298.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
          local_298.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
          local_298.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
          local_298.data._M_elems[8] = local_a8.data._M_elems[8];
          local_298.data._M_elems[9] = local_a8.data._M_elems[9];
          local_298.data._M_elems[10] = local_a8.data._M_elems[10];
          local_298.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
          local_298.data._M_elems[4] = local_a8.data._M_elems[4];
          local_298.data._M_elems[5] = local_a8.data._M_elems[5];
          local_298.data._M_elems[6] = local_a8.data._M_elems[6];
          local_298.data._M_elems[7] = local_a8.data._M_elems[7];
          local_298.exp = local_a8.exp;
          local_298.neg = local_a8.neg;
          local_298.prec_elem = local_a8.prec_elem;
          local_298.fpclass = local_a8.fpclass;
          if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
            local_298.neg = (bool)(local_a8.neg ^ 1);
          }
          uVar3 = uVar4;
          uVar9 = uVar5;
          if (((local_a8.fpclass != cpp_dec_float_NaN) &&
              (uVar3 = local_298.data._M_elems._0_8_, uVar9 = local_298.data._M_elems._8_8_,
              local_128.fpclass != cpp_dec_float_NaN)) &&
             (local_298.data._M_elems._0_8_ = uVar4, local_298.data._M_elems._8_8_ = uVar5,
             iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_128,&local_298), uVar3 = local_298.data._M_elems._0_8_,
             uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c8 + lVar21);
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_298,local_58);
            uVar3 = local_298.data._M_elems._0_8_;
            uVar9 = local_298.data._M_elems._8_8_;
            if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN)
                ) && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
                               compare(pcVar20,&local_298), uVar3 = local_298.data._M_elems._0_8_,
                     uVar9 = local_298.data._M_elems._8_8_, 0 < iVar13)) {
              local_248.fpclass = cpp_dec_float_finite;
              local_248.prec_elem = 0x10;
              local_248.data._M_elems[0] = 0;
              local_248.data._M_elems[1] = 0;
              local_248.data._M_elems[2] = 0;
              local_248.data._M_elems[3] = 0;
              local_248.data._M_elems[4] = 0;
              local_248.data._M_elems[5] = 0;
              local_248.data._M_elems[6] = 0;
              local_248.data._M_elems[7] = 0;
              local_248.data._M_elems[8] = 0;
              local_248.data._M_elems[9] = 0;
              local_248.data._M_elems[10] = 0;
              local_248.data._M_elems[0xb] = 0;
              local_248.data._M_elems[0xc] = 0;
              local_248.data._M_elems[0xd] = 0;
              local_248.data._M_elems._56_5_ = 0;
              local_248.data._M_elems[0xf]._1_3_ = 0;
              local_248.exp = 0;
              local_248.neg = false;
              if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_248,pcVar20);
                if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                  local_248.neg = (bool)(local_248.neg ^ 1);
                }
              }
              else {
                if (&local_248 != pcVar20) {
                  local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                  local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                  local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                  local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                  local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                  local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                  local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                  local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                  local_248.exp = pcVar20->exp;
                  local_248.neg = pcVar20->neg;
                  local_248.fpclass = pcVar20->fpclass;
                  local_248.prec_elem = pcVar20->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
              }
              local_198.fpclass = cpp_dec_float_finite;
              local_198.prec_elem = 0x10;
              local_198.data._M_elems[0] = 0;
              local_198.data._M_elems[1] = 0;
              local_198.data._M_elems[2] = 0;
              local_198.data._M_elems[3] = 0;
              local_198.data._M_elems[4] = 0;
              local_198.data._M_elems[5] = 0;
              local_198.data._M_elems[6] = 0;
              local_198.data._M_elems[7] = 0;
              local_198.data._M_elems[8] = 0;
              local_198.data._M_elems[9] = 0;
              local_198.data._M_elems[10] = 0;
              local_198.data._M_elems[0xb] = 0;
              local_198.data._M_elems[0xc] = 0;
              local_198.data._M_elems[0xd] = 0;
              local_198.data._M_elems._56_5_ = 0;
              local_198.data._M_elems[0xf]._1_3_ = 0;
              local_198.exp = 0;
              local_198.neg = false;
              if (&local_198 == local_140) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_198,&local_248);
                if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                  local_198.neg = (bool)(local_198.neg ^ 1);
                }
              }
              else {
                local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
                local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
                local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
                local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
                local_198.data._M_elems[8] = local_248.data._M_elems[8];
                local_198.data._M_elems[9] = local_248.data._M_elems[9];
                local_198.data._M_elems[10] = local_248.data._M_elems[10];
                local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
                local_198.data._M_elems[4] = local_248.data._M_elems[4];
                local_198.data._M_elems[5] = local_248.data._M_elems[5];
                local_198.data._M_elems[6] = local_248.data._M_elems[6];
                local_198.data._M_elems[7] = local_248.data._M_elems[7];
                local_198.data._M_elems[0] = local_248.data._M_elems[0];
                local_198.data._M_elems[1] = local_248.data._M_elems[1];
                local_198.data._M_elems[2] = local_248.data._M_elems[2];
                local_198.data._M_elems[3] = local_248.data._M_elems[3];
                local_198.exp = local_248.exp;
                local_198.neg = local_248.neg;
                local_198.fpclass = local_248.fpclass;
                local_198.prec_elem = local_248.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (&local_198,local_140);
              }
              goto LAB_00470531;
            }
          }
        }
        else {
          iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_128,&local_a8);
          if (iVar13 < 1) {
            goto LAB_0047013a;
          }
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b8 + lVar21);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x10;
          local_298.data._M_elems[0] = 0;
          local_298.data._M_elems[1] = 0;
          local_298.data._M_elems[2] = 0;
          local_298.data._M_elems[3] = 0;
          local_298.data._M_elems[4] = 0;
          local_298.data._M_elems[5] = 0;
          local_298.data._M_elems[6] = 0;
          local_298.data._M_elems[7] = 0;
          local_298.data._M_elems[8] = 0;
          local_298.data._M_elems[9] = 0;
          local_298.data._M_elems[10] = 0;
          local_298.data._M_elems[0xb] = 0;
          local_298.data._M_elems[0xc] = 0;
          local_298.data._M_elems[0xd] = 0;
          local_298.data._M_elems._56_5_ = 0;
          local_298.data._M_elems[0xf]._1_3_ = 0;
          local_298.exp = 0;
          local_298.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_298,local_48);
          uVar3 = local_298.data._M_elems._0_8_;
          uVar9 = local_298.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_298), uVar3 = local_298.data._M_elems._0_8_,
                uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x10;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems._56_5_ = 0;
            local_248.data._M_elems[0xf]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,pcVar20);
              if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                local_248.neg = (bool)(local_248.neg ^ 1);
              }
            }
            else {
              if (&local_248 != pcVar20) {
                local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_248.exp = pcVar20->exp;
                local_248.neg = pcVar20->neg;
                local_248.fpclass = pcVar20->fpclass;
                local_248.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d8));
            }
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            pcVar20 = &local_248;
            if (&local_198 != local_140) {
              local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_248.data._M_elems[8];
              local_198.data._M_elems[9] = local_248.data._M_elems[9];
              local_198.data._M_elems[10] = local_248.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_248.data._M_elems[4];
              local_198.data._M_elems[5] = local_248.data._M_elems[5];
              local_198.data._M_elems[6] = local_248.data._M_elems[6];
              local_198.data._M_elems[7] = local_248.data._M_elems[7];
              local_198.data._M_elems[0] = local_248.data._M_elems[0];
              local_198.data._M_elems[1] = local_248.data._M_elems[1];
              local_198.data._M_elems[2] = local_248.data._M_elems[2];
              local_198.data._M_elems[3] = local_248.data._M_elems[3];
              local_198.exp = local_248.exp;
              local_198.neg = local_248.neg;
              local_198.fpclass = local_248.fpclass;
              local_198.prec_elem = local_248.prec_elem;
              pcVar20 = local_140;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_198,pcVar20);
LAB_00470531:
            local_298.fpclass = cpp_dec_float_finite;
            local_298.prec_elem = 0x10;
            local_298.data._M_elems[0] = 0;
            local_298.data._M_elems[1] = 0;
            local_298.data._M_elems[2] = 0;
            local_298.data._M_elems[3] = 0;
            local_298.data._M_elems[4] = 0;
            local_298.data._M_elems[5] = 0;
            local_298.data._M_elems[6] = 0;
            local_298.data._M_elems[7] = 0;
            local_298.data._M_elems[8] = 0;
            local_298.data._M_elems[9] = 0;
            local_298.data._M_elems[10] = 0;
            local_298.data._M_elems[0xb] = 0;
            local_298.data._M_elems[0xc] = 0;
            local_298.data._M_elems[0xd] = 0;
            local_298.data._M_elems._56_5_ = 0;
            local_298.data._M_elems[0xf]._1_3_ = 0;
            local_298.exp = 0;
            local_298.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&local_298,&local_198,&local_128);
            uVar3 = local_298.data._M_elems._0_8_;
            uVar9 = local_298.data._M_elems._8_8_;
            if (((local_298.fpclass != cpp_dec_float_NaN) &&
                (local_1f8.fpclass != cpp_dec_float_NaN)) &&
               (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_298,&local_1f8), uVar3 = local_298.data._M_elems._0_8_,
               uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
              iVar13 = (*(local_1a0->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              local_138 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_12,iVar13),iVar12);
              local_1f8.data._M_elems[4] = local_298.data._M_elems[4];
              local_1f8.data._M_elems[5] = local_298.data._M_elems[5];
              local_1f8.data._M_elems[6] = local_298.data._M_elems[6];
              local_1f8.data._M_elems[7] = local_298.data._M_elems[7];
              local_1f8.data._M_elems[8] = local_298.data._M_elems[8];
              local_1f8.data._M_elems[9] = local_298.data._M_elems[9];
              local_1f8.data._M_elems[10] = local_298.data._M_elems[10];
              local_1f8.data._M_elems[0xb] = local_298.data._M_elems[0xb];
              local_1f8.data._M_elems[0xc] = local_298.data._M_elems[0xc];
              local_1f8.data._M_elems[0xd] = local_298.data._M_elems[0xd];
              local_1f8.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
              local_1f8.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
              local_1f8.data._M_elems[0] = local_298.data._M_elems[0];
              local_1f8.data._M_elems[1] = local_298.data._M_elems[1];
              local_1f8.data._M_elems[2] = local_298.data._M_elems[2];
              local_1f8.data._M_elems[3] = local_298.data._M_elems[3];
              local_1f8.exp = local_298.exp;
              local_1f8.neg = local_298.neg;
              local_1f8.fpclass = local_298.fpclass;
              local_1f8.prec_elem = local_298.prec_elem;
              local_2ac = (uint)lVar18;
              uVar3 = local_298.data._M_elems._0_8_;
              uVar9 = local_298.data._M_elems._8_8_;
            }
          }
        }
        local_298.data._M_elems._8_8_ = uVar9;
        local_298.data._M_elems._0_8_ = uVar3;
        lVar18 = lVar18 + 1;
      } while (lVar18 < *(int *)(lVar14 + 0x70));
    }
    if (*(int *)(local_130 + 0x70) < 1) {
LAB_00471d64:
      lVar16 = local_c8;
      max_00 = local_148;
      if ((int)local_2ac < 0) goto LAB_004721e9;
      lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x78) + (ulong)local_2ac * 4);
      lVar18 = lVar14 * 0x50;
      local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar17 + lVar18);
      local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar17 + lVar18) + 2);
      puVar1 = (uint *)(lVar17 + 0x10 + lVar18);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar17 + 0x20 + lVar18);
      local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar17 + 0x30 + lVar18);
      local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_128.exp = *(int *)(lVar17 + 0x40 + lVar18);
      local_128.neg = *(bool *)(lVar17 + 0x44 + lVar18);
      local_128._72_8_ = *(undefined8 *)(lVar17 + 0x48 + lVar18);
      if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_128,&local_a8), 0 < iVar12)) {
        lVar16 = local_b8;
      }
      goto LAB_0047203b;
    }
    local_48 = *(double *)(in_FS_OFFSET + -8);
    local_140 = &(local_1a0->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend;
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    local_29c = 0xffffffff;
    lVar18 = 0;
    do {
      iVar12 = *(int *)(*(long *)(local_130 + 0x78) + lVar18 * 4);
      lVar21 = (long)iVar12 * 0x50;
      local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar21);
      local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar21) + 2);
      puVar1 = (uint *)(lVar16 + 0x10 + lVar21);
      local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar16 + 0x20 + lVar21);
      local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar16 + 0x30 + lVar21);
      local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_128.exp = *(int *)(lVar16 + 0x40 + lVar21);
      local_128.neg = *(bool *)(lVar16 + 0x44 + lVar21);
      local_128._72_8_ = *(undefined8 *)(lVar16 + 0x48 + lVar21);
      if (local_a8.fpclass == cpp_dec_float_NaN || local_128.fpclass == cpp_dec_float_NaN) {
LAB_004717a2:
        uVar6._0_4_ = local_a8.data._M_elems[0];
        uVar6._4_4_ = local_a8.data._M_elems[1];
        local_298.data._M_elems[0] = local_a8.data._M_elems[0];
        local_298.data._M_elems[1] = local_a8.data._M_elems[1];
        uVar7._0_4_ = local_a8.data._M_elems[2];
        uVar7._4_4_ = local_a8.data._M_elems[3];
        local_298.data._M_elems[2] = local_a8.data._M_elems[2];
        local_298.data._M_elems[3] = local_a8.data._M_elems[3];
        local_298.data._M_elems[0xc] = local_a8.data._M_elems[0xc];
        local_298.data._M_elems[0xd] = local_a8.data._M_elems[0xd];
        local_298.data._M_elems._56_5_ = local_a8.data._M_elems._56_5_;
        local_298.data._M_elems[0xf]._1_3_ = local_a8.data._M_elems[0xf]._1_3_;
        local_298.data._M_elems[8] = local_a8.data._M_elems[8];
        local_298.data._M_elems[9] = local_a8.data._M_elems[9];
        local_298.data._M_elems[10] = local_a8.data._M_elems[10];
        local_298.data._M_elems[0xb] = local_a8.data._M_elems[0xb];
        local_298.data._M_elems[4] = local_a8.data._M_elems[4];
        local_298.data._M_elems[5] = local_a8.data._M_elems[5];
        local_298.data._M_elems[6] = local_a8.data._M_elems[6];
        local_298.data._M_elems[7] = local_a8.data._M_elems[7];
        local_298.exp = local_a8.exp;
        local_298.neg = local_a8.neg;
        local_298.prec_elem = local_a8.prec_elem;
        local_298.fpclass = local_a8.fpclass;
        if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
          local_298.neg = (bool)(local_a8.neg ^ 1);
        }
        uVar3 = uVar6;
        uVar9 = uVar7;
        if (((local_a8.fpclass != cpp_dec_float_NaN) &&
            (uVar3 = local_298.data._M_elems._0_8_, uVar9 = local_298.data._M_elems._8_8_,
            local_128.fpclass != cpp_dec_float_NaN)) &&
           (local_298.data._M_elems._0_8_ = uVar6, local_298.data._M_elems._8_8_ = uVar7,
           iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_128,&local_298), uVar3 = local_298.data._M_elems._0_8_,
           uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_c0 + lVar21);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x10;
          local_298.data._M_elems[0] = 0;
          local_298.data._M_elems[1] = 0;
          local_298.data._M_elems[2] = 0;
          local_298.data._M_elems[3] = 0;
          local_298.data._M_elems[4] = 0;
          local_298.data._M_elems[5] = 0;
          local_298.data._M_elems[6] = 0;
          local_298.data._M_elems[7] = 0;
          local_298.data._M_elems[8] = 0;
          local_298.data._M_elems[9] = 0;
          local_298.data._M_elems[10] = 0;
          local_298.data._M_elems[0xb] = 0;
          local_298.data._M_elems[0xc] = 0;
          local_298.data._M_elems[0xd] = 0;
          local_298.data._M_elems._56_5_ = 0;
          local_298.data._M_elems[0xf]._1_3_ = 0;
          local_298.exp = 0;
          local_298.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_298,local_58);
          uVar3 = local_298.data._M_elems._0_8_;
          uVar9 = local_298.data._M_elems._8_8_;
          if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (pcVar20,&local_298), uVar3 = local_298.data._M_elems._0_8_,
                uVar9 = local_298.data._M_elems._8_8_, 0 < iVar13)) {
            local_248.fpclass = cpp_dec_float_finite;
            local_248.prec_elem = 0x10;
            local_248.data._M_elems[0] = 0;
            local_248.data._M_elems[1] = 0;
            local_248.data._M_elems[2] = 0;
            local_248.data._M_elems[3] = 0;
            local_248.data._M_elems[4] = 0;
            local_248.data._M_elems[5] = 0;
            local_248.data._M_elems[6] = 0;
            local_248.data._M_elems[7] = 0;
            local_248.data._M_elems[8] = 0;
            local_248.data._M_elems[9] = 0;
            local_248.data._M_elems[10] = 0;
            local_248.data._M_elems[0xb] = 0;
            local_248.data._M_elems[0xc] = 0;
            local_248.data._M_elems[0xd] = 0;
            local_248.data._M_elems._56_5_ = 0;
            local_248.data._M_elems[0xf]._1_3_ = 0;
            local_248.exp = 0;
            local_248.neg = false;
            if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d0)) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,pcVar20);
              if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
                local_248.neg = (bool)(local_248.neg ^ 1);
              }
            }
            else {
              if (&local_248 != pcVar20) {
                local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
                local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
                local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
                local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
                local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
                local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
                local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
                local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_248.exp = pcVar20->exp;
                local_248.neg = pcVar20->neg;
                local_248.fpclass = pcVar20->fpclass;
                local_248.prec_elem = pcVar20->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d0));
            }
            local_198.fpclass = cpp_dec_float_finite;
            local_198.prec_elem = 0x10;
            local_198.data._M_elems[0] = 0;
            local_198.data._M_elems[1] = 0;
            local_198.data._M_elems[2] = 0;
            local_198.data._M_elems[3] = 0;
            local_198.data._M_elems[4] = 0;
            local_198.data._M_elems[5] = 0;
            local_198.data._M_elems[6] = 0;
            local_198.data._M_elems[7] = 0;
            local_198.data._M_elems[8] = 0;
            local_198.data._M_elems[9] = 0;
            local_198.data._M_elems[10] = 0;
            local_198.data._M_elems[0xb] = 0;
            local_198.data._M_elems[0xc] = 0;
            local_198.data._M_elems[0xd] = 0;
            local_198.data._M_elems._56_5_ = 0;
            local_198.data._M_elems[0xf]._1_3_ = 0;
            local_198.exp = 0;
            local_198.neg = false;
            if (&local_198 == local_140) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,&local_248);
              if (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) {
                local_198.neg = (bool)(local_198.neg ^ 1);
              }
            }
            else {
              local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
              local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
              local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
              local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
              local_198.data._M_elems[8] = local_248.data._M_elems[8];
              local_198.data._M_elems[9] = local_248.data._M_elems[9];
              local_198.data._M_elems[10] = local_248.data._M_elems[10];
              local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
              local_198.data._M_elems[4] = local_248.data._M_elems[4];
              local_198.data._M_elems[5] = local_248.data._M_elems[5];
              local_198.data._M_elems[6] = local_248.data._M_elems[6];
              local_198.data._M_elems[7] = local_248.data._M_elems[7];
              local_198.data._M_elems[0] = local_248.data._M_elems[0];
              local_198.data._M_elems[1] = local_248.data._M_elems[1];
              local_198.data._M_elems[2] = local_248.data._M_elems[2];
              local_198.data._M_elems[3] = local_248.data._M_elems[3];
              local_198.exp = local_248.exp;
              local_198.neg = local_248.neg;
              local_198.fpclass = local_248.fpclass;
              local_198.prec_elem = local_248.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&local_198,local_140);
            }
            goto LAB_00471b9c;
          }
        }
      }
      else {
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_128,&local_a8);
        if (iVar13 < 1) {
          goto LAB_004717a2;
        }
        ::soplex::infinity::__tls_init();
        pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_b0 + lVar21);
        local_298.fpclass = cpp_dec_float_finite;
        local_298.prec_elem = 0x10;
        local_298.data._M_elems[0] = 0;
        local_298.data._M_elems[1] = 0;
        local_298.data._M_elems[2] = 0;
        local_298.data._M_elems[3] = 0;
        local_298.data._M_elems[4] = 0;
        local_298.data._M_elems[5] = 0;
        local_298.data._M_elems[6] = 0;
        local_298.data._M_elems[7] = 0;
        local_298.data._M_elems[8] = 0;
        local_298.data._M_elems[9] = 0;
        local_298.data._M_elems[10] = 0;
        local_298.data._M_elems[0xb] = 0;
        local_298.data._M_elems[0xc] = 0;
        local_298.data._M_elems[0xd] = 0;
        local_298.data._M_elems._56_5_ = 0;
        local_298.data._M_elems[0xf]._1_3_ = 0;
        local_298.exp = 0;
        local_298.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_298,local_48);
        uVar3 = local_298.data._M_elems._0_8_;
        uVar9 = local_298.data._M_elems._8_8_;
        if (((pcVar20->fpclass != cpp_dec_float_NaN) && (local_298.fpclass != cpp_dec_float_NaN)) &&
           (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (pcVar20,&local_298), uVar3 = local_298.data._M_elems._0_8_,
           uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
          local_248.fpclass = cpp_dec_float_finite;
          local_248.prec_elem = 0x10;
          local_248.data._M_elems[0] = 0;
          local_248.data._M_elems[1] = 0;
          local_248.data._M_elems[2] = 0;
          local_248.data._M_elems[3] = 0;
          local_248.data._M_elems[4] = 0;
          local_248.data._M_elems[5] = 0;
          local_248.data._M_elems[6] = 0;
          local_248.data._M_elems[7] = 0;
          local_248.data._M_elems[8] = 0;
          local_248.data._M_elems[9] = 0;
          local_248.data._M_elems[10] = 0;
          local_248.data._M_elems[0xb] = 0;
          local_248.data._M_elems[0xc] = 0;
          local_248.data._M_elems[0xd] = 0;
          local_248.data._M_elems._56_5_ = 0;
          local_248.data._M_elems[0xf]._1_3_ = 0;
          local_248.exp = 0;
          local_248.neg = false;
          if (&local_248 == (cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d0)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_248,pcVar20);
            if (local_248.data._M_elems[0] != 0 || local_248.fpclass != cpp_dec_float_finite) {
              local_248.neg = (bool)(local_248.neg ^ 1);
            }
          }
          else {
            if (&local_248 != pcVar20) {
              local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar20->data)._M_elems;
              local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 2);
              local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 4);
              local_248.data._M_elems._24_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 6);
              local_248.data._M_elems._32_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 8);
              local_248.data._M_elems._40_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 10);
              local_248.data._M_elems._48_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
              uVar3 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
              local_248.data._M_elems._56_5_ = SUB85(uVar3,0);
              local_248.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_248.exp = pcVar20->exp;
              local_248.neg = pcVar20->neg;
              local_248.fpclass = pcVar20->fpclass;
              local_248.prec_elem = pcVar20->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&local_248,(cpp_dec_float<100U,_int,_void> *)(lVar21 + local_d0));
          }
          local_198.fpclass = cpp_dec_float_finite;
          local_198.prec_elem = 0x10;
          local_198.data._M_elems[0] = 0;
          local_198.data._M_elems[1] = 0;
          local_198.data._M_elems[2] = 0;
          local_198.data._M_elems[3] = 0;
          local_198.data._M_elems[4] = 0;
          local_198.data._M_elems[5] = 0;
          local_198.data._M_elems[6] = 0;
          local_198.data._M_elems[7] = 0;
          local_198.data._M_elems[8] = 0;
          local_198.data._M_elems[9] = 0;
          local_198.data._M_elems[10] = 0;
          local_198.data._M_elems[0xb] = 0;
          local_198.data._M_elems[0xc] = 0;
          local_198.data._M_elems[0xd] = 0;
          local_198.data._M_elems._56_5_ = 0;
          local_198.data._M_elems[0xf]._1_3_ = 0;
          local_198.exp = 0;
          local_198.neg = false;
          pcVar20 = &local_248;
          if (&local_198 != local_140) {
            local_198.data._M_elems[0xc] = local_248.data._M_elems[0xc];
            local_198.data._M_elems[0xd] = local_248.data._M_elems[0xd];
            local_198.data._M_elems._56_5_ = local_248.data._M_elems._56_5_;
            local_198.data._M_elems[0xf]._1_3_ = local_248.data._M_elems[0xf]._1_3_;
            local_198.data._M_elems[8] = local_248.data._M_elems[8];
            local_198.data._M_elems[9] = local_248.data._M_elems[9];
            local_198.data._M_elems[10] = local_248.data._M_elems[10];
            local_198.data._M_elems[0xb] = local_248.data._M_elems[0xb];
            local_198.data._M_elems[4] = local_248.data._M_elems[4];
            local_198.data._M_elems[5] = local_248.data._M_elems[5];
            local_198.data._M_elems[6] = local_248.data._M_elems[6];
            local_198.data._M_elems[7] = local_248.data._M_elems[7];
            local_198.data._M_elems[0] = local_248.data._M_elems[0];
            local_198.data._M_elems[1] = local_248.data._M_elems[1];
            local_198.data._M_elems[2] = local_248.data._M_elems[2];
            local_198.data._M_elems[3] = local_248.data._M_elems[3];
            local_198.exp = local_248.exp;
            local_198.neg = local_248.neg;
            local_198.fpclass = local_248.fpclass;
            local_198.prec_elem = local_248.prec_elem;
            pcVar20 = local_140;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_198,pcVar20);
LAB_00471b9c:
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x10;
          local_298.data._M_elems[0] = 0;
          local_298.data._M_elems[1] = 0;
          local_298.data._M_elems[2] = 0;
          local_298.data._M_elems[3] = 0;
          local_298.data._M_elems[4] = 0;
          local_298.data._M_elems[5] = 0;
          local_298.data._M_elems[6] = 0;
          local_298.data._M_elems[7] = 0;
          local_298.data._M_elems[8] = 0;
          local_298.data._M_elems[9] = 0;
          local_298.data._M_elems[10] = 0;
          local_298.data._M_elems[0xb] = 0;
          local_298.data._M_elems[0xc] = 0;
          local_298.data._M_elems[0xd] = 0;
          local_298.data._M_elems._56_5_ = 0;
          local_298.data._M_elems[0xf]._1_3_ = 0;
          local_298.exp = 0;
          local_298.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_298,&local_198,&local_128);
          uVar3 = local_298.data._M_elems._0_8_;
          uVar9 = local_298.data._M_elems._8_8_;
          if (((local_298.fpclass != cpp_dec_float_NaN) && (local_1f8.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_298,&local_1f8), uVar3 = local_298.data._M_elems._0_8_,
                uVar9 = local_298.data._M_elems._8_8_, iVar13 < 0)) {
            iVar13 = (*(local_1a0->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            local_138 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_15,iVar13),iVar12);
            local_1f8.data._M_elems[4] = local_298.data._M_elems[4];
            local_1f8.data._M_elems[5] = local_298.data._M_elems[5];
            local_1f8.data._M_elems[6] = local_298.data._M_elems[6];
            local_1f8.data._M_elems[7] = local_298.data._M_elems[7];
            local_1f8.data._M_elems[8] = local_298.data._M_elems[8];
            local_1f8.data._M_elems[9] = local_298.data._M_elems[9];
            local_1f8.data._M_elems[10] = local_298.data._M_elems[10];
            local_1f8.data._M_elems[0xb] = local_298.data._M_elems[0xb];
            local_1f8.data._M_elems[0xc] = local_298.data._M_elems[0xc];
            local_1f8.data._M_elems[0xd] = local_298.data._M_elems[0xd];
            local_1f8.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
            local_1f8.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
            local_1f8.data._M_elems[0] = local_298.data._M_elems[0];
            local_1f8.data._M_elems[1] = local_298.data._M_elems[1];
            local_1f8.data._M_elems[2] = local_298.data._M_elems[2];
            local_1f8.data._M_elems[3] = local_298.data._M_elems[3];
            local_1f8.exp = local_298.exp;
            local_1f8.neg = local_298.neg;
            local_1f8.fpclass = local_298.fpclass;
            local_1f8.prec_elem = local_298.prec_elem;
            local_29c = (uint)lVar18;
            uVar3 = local_298.data._M_elems._0_8_;
            uVar9 = local_298.data._M_elems._8_8_;
          }
        }
      }
      local_298.data._M_elems._8_8_ = uVar9;
      local_298.data._M_elems._0_8_ = uVar3;
      lVar19 = local_c0;
      max_00 = local_148;
      lVar18 = lVar18 + 1;
    } while (lVar18 < *(int *)(local_130 + 0x70));
    if ((int)local_29c < 0) goto LAB_00471d64;
    lVar17 = (long)*(int *)(*(long *)(local_130 + 0x78) + (ulong)local_29c * 4);
    lVar14 = lVar17 * 0x50;
    local_128.data._M_elems._0_8_ = *(undefined8 *)(lVar16 + lVar14);
    local_128.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar16 + lVar14) + 2);
    puVar1 = (uint *)(lVar16 + 0x10 + lVar14);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar16 + 0x20 + lVar14);
    local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar16 + 0x30 + lVar14);
    local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_128.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_128.exp = *(int *)(lVar16 + 0x40 + lVar14);
    local_128.neg = *(bool *)(lVar16 + 0x44 + lVar14);
    local_128._72_8_ = *(undefined8 *)(lVar16 + 0x48 + lVar14);
    if (((local_128.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
       (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_128,&local_a8), 0 < iVar12)) {
      lVar19 = local_b0;
    }
LAB_00471f1d:
    lVar17 = lVar17 * 0x50;
    local_1f8.data._M_elems._0_8_ = *(undefined8 *)(lVar19 + lVar17);
    local_1f8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar19 + lVar17) + 2);
    puVar1 = (uint *)(lVar19 + 0x10 + lVar17);
    local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar19 + 0x20 + lVar17);
    local_1f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar19 + 0x30 + lVar17);
    local_1f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_1f8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_1f8.exp = *(int *)(lVar19 + 0x40 + lVar17);
    local_1f8.neg = *(bool *)(lVar19 + 0x44 + lVar17);
    local_1f8.fpclass = *(fpclass_type *)(lVar19 + 0x48 + lVar17);
    local_1f8.prec_elem = *(int32_t *)(lVar19 + 0x4c + lVar17);
    pcVar20 = (cpp_dec_float<100U,_int,_void> *)(local_d0 + lVar17);
    if (&local_198 == pcVar20) goto LAB_0047212e;
    local_198.data._M_elems._56_5_ = local_1f8.data._M_elems._56_5_;
    local_198.data._M_elems[0xf]._1_3_ = local_1f8.data._M_elems[0xf]._1_3_;
    local_198.prec_elem = local_1f8.prec_elem;
    local_198.fpclass = local_1f8.fpclass;
    local_198.data._M_elems._0_8_ = local_1f8.data._M_elems._0_8_;
    local_198.data._M_elems._8_8_ = local_1f8.data._M_elems._8_8_;
    local_198.data._M_elems._16_8_ = local_1f8.data._M_elems._16_8_;
    local_198.data._M_elems._24_8_ = local_1f8.data._M_elems._24_8_;
    local_198.data._M_elems._32_8_ = local_1f8.data._M_elems._32_8_;
    local_198.data._M_elems._40_8_ = local_1f8.data._M_elems._40_8_;
    local_198.data._M_elems._48_8_ = local_1f8.data._M_elems._48_8_;
    local_198.exp = local_1f8.exp;
    local_198.neg = local_1f8.neg;
LAB_00472127:
    local_1f8.data._M_elems._0_8_ = local_198.data._M_elems._0_8_;
    local_1f8.data._M_elems._8_8_ = local_198.data._M_elems._8_8_;
    local_1f8.data._M_elems._16_8_ = local_198.data._M_elems._16_8_;
    local_1f8.data._M_elems._24_8_ = local_198.data._M_elems._24_8_;
    local_1f8.data._M_elems._32_8_ = local_198.data._M_elems._32_8_;
    local_1f8.data._M_elems._40_8_ = local_198.data._M_elems._40_8_;
    local_1f8.data._M_elems._48_8_ = local_198.data._M_elems._48_8_;
    local_1f8.exp = local_198.exp;
    local_1f8.neg = local_198.neg;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_198,pcVar20);
  }
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 0x10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems[6] = 0;
  local_298.data._M_elems[7] = 0;
  local_298.data._M_elems[8] = 0;
  local_298.data._M_elems[9] = 0;
  local_298.data._M_elems[10] = 0;
  local_298.data._M_elems[0xb] = 0;
  local_298.data._M_elems[0xc] = 0;
  local_298.data._M_elems[0xd] = 0;
  local_298.data._M_elems._56_5_ = 0;
  local_298.data._M_elems[0xf]._1_3_ = 0;
  local_298.exp = 0;
  local_298.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_298,&local_198,&local_128);
  local_1f8.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
  local_1f8.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
  local_1f8.data._M_elems[0xc] = local_298.data._M_elems[0xc];
  local_1f8.data._M_elems[0xd] = local_298.data._M_elems[0xd];
  local_1f8.data._M_elems[8] = local_298.data._M_elems[8];
  local_1f8.data._M_elems[9] = local_298.data._M_elems[9];
  local_1f8.data._M_elems[10] = local_298.data._M_elems[10];
  local_1f8.data._M_elems[0xb] = local_298.data._M_elems[0xb];
  local_1f8.data._M_elems[4] = local_298.data._M_elems[4];
  local_1f8.data._M_elems[5] = local_298.data._M_elems[5];
  local_1f8.data._M_elems[6] = local_298.data._M_elems[6];
  local_1f8.data._M_elems[7] = local_298.data._M_elems[7];
  local_1f8.data._M_elems[0] = local_298.data._M_elems[0];
  local_1f8.data._M_elems[1] = local_298.data._M_elems[1];
  local_1f8.data._M_elems[2] = local_298.data._M_elems[2];
  local_1f8.data._M_elems[3] = local_298.data._M_elems[3];
  local_1f8.exp = local_298.exp;
  local_1f8.neg = local_298.neg;
  local_1f8.fpclass = local_298.fpclass;
  local_1f8.prec_elem = local_298.prec_elem;
LAB_004721e9:
  if (local_138.info != 0) {
    iVar12 = (*(local_1a0->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_16,iVar12),(SPxId *)&local_138);
    if (bVar11) {
      lVar17 = 0xc38;
      if ((-1 < (int)local_29c) || (lVar17 = 0xc40, local_29c = local_2ac, -1 < (int)local_2ac)) {
        iVar12 = (*(local_1a0->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar17 = *(long *)(CONCAT44(extraout_var_17,iVar12) + lVar17);
        lVar14 = *(long *)(lVar17 + 0x88);
        lVar16 = (long)*(int *)(*(long *)(lVar17 + 0x78) + (ulong)local_29c * 4) * 0x50;
        *(undefined8 *)(lVar14 + 0x48 + lVar16) = 0x1000000000;
        *(undefined8 *)(lVar14 + lVar16) = 0;
        ((undefined8 *)(lVar14 + lVar16))[1] = 0;
        puVar2 = (undefined8 *)(lVar14 + 0x10 + lVar16);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar14 + 0x20 + lVar16);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)(lVar14 + 0x30 + lVar16);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)(lVar14 + 0x3d + lVar16) = 0;
        iVar12 = *(int *)(lVar17 + 0x70);
        *(int *)(lVar17 + 0x70) = iVar12 + -1;
        *(undefined4 *)(*(long *)(lVar17 + 0x78) + (ulong)local_29c * 4) =
             *(undefined4 *)(*(long *)(lVar17 + 0x78) + -4 + (long)iVar12 * 4);
      }
      DVar15 = (DataKey)selectEnter(local_1a0,max_00,0,false);
      return (SPxId)DVar15;
    }
  }
  *(undefined8 *)((max_00->m_backend).data._M_elems + 0xc) = local_1f8.data._M_elems._48_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 0xe) = local_1f8.data._M_elems._56_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 8) = local_1f8.data._M_elems._32_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 10) = local_1f8.data._M_elems._40_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 4) = local_1f8.data._M_elems._16_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 6) = local_1f8.data._M_elems._24_8_;
  *(undefined8 *)(max_00->m_backend).data._M_elems = local_1f8.data._M_elems._0_8_;
  *(undefined8 *)((max_00->m_backend).data._M_elems + 2) = local_1f8.data._M_elems._8_8_;
  (max_00->m_backend).exp = local_1f8.exp;
  (max_00->m_backend).neg = local_1f8.neg;
  (max_00->m_backend).fpclass = local_1f8.fpclass;
  (max_00->m_backend).prec_elem = local_1f8.prec_elem;
  return (SPxId)local_138;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}